

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

VkResult __thiscall
VmaAllocator_T::BindBufferMemory
          (VmaAllocator_T *this,VmaAllocation hAllocation,VkDeviceSize allocationLocalOffset,
          VkBuffer hBuffer,void *pNext)

{
  VkResult VVar1;
  VkDeviceMemory memory;
  
  if (hAllocation->m_Type == '\x01') {
    VVar1 = VmaDeviceMemoryBlock::BindBufferMemory
                      ((hAllocation->field_0).m_BlockAllocation.m_Block,this,hAllocation,
                       allocationLocalOffset,hBuffer,pNext);
    return VVar1;
  }
  if (hAllocation->m_Type == '\x02') {
    memory = VmaAllocation_T::GetMemory(hAllocation);
    VVar1 = BindVulkanBuffer(this,memory,allocationLocalOffset,hBuffer,pNext);
    return VVar1;
  }
  return VK_SUCCESS;
}

Assistant:

VkResult VmaAllocator_T::BindBufferMemory(
    VmaAllocation hAllocation,
    VkDeviceSize allocationLocalOffset,
    VkBuffer hBuffer,
    const void* pNext)
{
    VkResult res = VK_SUCCESS;
    switch(hAllocation->GetType())
    {
    case VmaAllocation_T::ALLOCATION_TYPE_DEDICATED:
        res = BindVulkanBuffer(hAllocation->GetMemory(), allocationLocalOffset, hBuffer, pNext);
        break;
    case VmaAllocation_T::ALLOCATION_TYPE_BLOCK:
    {
        VmaDeviceMemoryBlock* const pBlock = hAllocation->GetBlock();
        VMA_ASSERT(pBlock && "Binding buffer to allocation that doesn't belong to any block.");
        res = pBlock->BindBufferMemory(this, hAllocation, allocationLocalOffset, hBuffer, pNext);
        break;
    }
    default:
        VMA_ASSERT(0);
    }
    return res;
}